

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O0

string * cmCurlSetCAInfo(string *__return_storage_ptr__,CURL *curl,string *cafile)

{
  char cVar1;
  bool bVar2;
  CURLcode error;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  allocator<char> local_91;
  CURLcode res_5;
  CURLcode local_6c;
  CURLcode local_68;
  CURLcode res_4;
  CURLcode res_3;
  CURLcode res_2;
  CURLcode res_1;
  CURLcode local_4c;
  undefined1 local_48 [4];
  CURLcode res;
  string env_ca;
  string *cafile_local;
  CURL *curl_local;
  string *e;
  
  env_ca.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_48);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    local_4c = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,uVar4);
    if ((local_4c != CURLE_OK) && (local_4c != CURLE_NOT_BUILT_IN)) {
      cVar1 = std::__cxx11::string::empty();
      pcVar5 = "\n";
      if (cVar1 != '\0') {
        pcVar5 = "";
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
      pcVar5 = curl_easy_strerror(local_4c);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
    }
  }
  else {
    bVar2 = cmsys::SystemTools::GetEnv("SSL_CERT_FILE",(string *)local_48);
    if ((bVar2) && (bVar2 = cmsys::SystemTools::FileExists((string *)local_48,true), bVar2)) {
      uVar4 = std::__cxx11::string::c_str();
      res_3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,uVar4);
      if ((res_3 != CURLE_OK) && (res_3 != CURLE_NOT_BUILT_IN)) {
        cVar1 = std::__cxx11::string::empty();
        pcVar5 = "\n";
        if (cVar1 != '\0') {
          pcVar5 = "";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
        pcVar5 = curl_easy_strerror(res_3);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
      }
    }
    else {
      bVar2 = cmsys::SystemTools::GetEnv("SSL_CERT_DIR",(string *)local_48);
      if ((bVar2) && (bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_48), bVar2)) {
        uVar4 = std::__cxx11::string::c_str();
        res_4 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAPATH,uVar4);
        if ((res_4 != CURLE_OK) && (res_4 != CURLE_NOT_BUILT_IN)) {
          cVar1 = std::__cxx11::string::empty();
          pcVar5 = "\n";
          if (cVar1 != '\0') {
            pcVar5 = "";
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
          pcVar5 = curl_easy_strerror(res_4);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
        }
      }
      else {
        bVar2 = cmsys::SystemTools::FileExists("/etc/pki/tls/certs/ca-bundle.crt",true);
        if (bVar2) {
          local_68 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,
                                      "/etc/pki/tls/certs/ca-bundle.crt");
          if ((local_68 != CURLE_OK) && (local_68 != CURLE_NOT_BUILT_IN)) {
            cVar1 = std::__cxx11::string::empty();
            pcVar5 = "\n";
            if (cVar1 != '\0') {
              pcVar5 = "";
            }
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
            pcVar5 = curl_easy_strerror(local_68);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
          }
        }
        else {
          bVar2 = cmsys::SystemTools::FileExists("/etc/ssl/certs/ca-certificates.crt",true);
          if (((bVar2) &&
              (local_6c = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAINFO,
                                           "/etc/ssl/certs/ca-certificates.crt"),
              local_6c != CURLE_OK)) && (local_6c != CURLE_NOT_BUILT_IN)) {
            cVar1 = std::__cxx11::string::empty();
            pcVar5 = "\n";
            if (cVar1 != '\0') {
              pcVar5 = "";
            }
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAINFO: ");
            pcVar5 = curl_easy_strerror(local_6c);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&res_5,"/etc/ssl/certs",&local_91);
          bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&res_5);
          std::__cxx11::string::~string((string *)&res_5);
          std::allocator<char>::~allocator(&local_91);
          if (((bVar2) &&
              (error = curl_easy_setopt((Curl_easy *)curl,CURLOPT_CAPATH,"/etc/ssl/certs"),
              error != CURLE_OK)) && (error != CURLE_NOT_BUILT_IN)) {
            cVar1 = std::__cxx11::string::empty();
            pcVar5 = "\n";
            if (cVar1 != '\0') {
              pcVar5 = "";
            }
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,"Unable to set TLS/SSL Verify CAPATH: ");
            pcVar5 = curl_easy_strerror(error);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
          }
        }
      }
    }
  }
  env_ca.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((env_ca.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetCAInfo(::CURL* curl, const std::string& cafile)
{
  std::string e;
  std::string env_ca;
  if (!cafile.empty()) {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAINFO, cafile.c_str());
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
  /* Honor the user-configurable OpenSSL environment variables. */
  else if (cmSystemTools::GetEnv("SSL_CERT_FILE", env_ca) &&
           cmSystemTools::FileExists(env_ca, true)) {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAINFO, env_ca.c_str());
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  } else if (cmSystemTools::GetEnv("SSL_CERT_DIR", env_ca) &&
             cmSystemTools::FileIsDirectory(env_ca)) {
    ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_CAPATH, env_ca.c_str());
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
#ifdef CMAKE_FIND_CAFILE
#  define CMAKE_CAFILE_FEDORA "/etc/pki/tls/certs/ca-bundle.crt"
  else if (cmSystemTools::FileExists(CMAKE_CAFILE_FEDORA, true)) {
    ::CURLcode res =
      ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_FEDORA);
    check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
  }
#  undef CMAKE_CAFILE_FEDORA
  else {
#  define CMAKE_CAFILE_COMMON "/etc/ssl/certs/ca-certificates.crt"
    if (cmSystemTools::FileExists(CMAKE_CAFILE_COMMON, true)) {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAINFO, CMAKE_CAFILE_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAINFO: ");
    }
#  undef CMAKE_CAFILE_COMMON
#  define CMAKE_CAPATH_COMMON "/etc/ssl/certs"
    if (cmSystemTools::FileIsDirectory(CMAKE_CAPATH_COMMON)) {
      ::CURLcode res =
        ::curl_easy_setopt(curl, CURLOPT_CAPATH, CMAKE_CAPATH_COMMON);
      check_curl_result(res, "Unable to set TLS/SSL Verify CAPATH: ");
    }
#  undef CMAKE_CAPATH_COMMON
  }
#endif
  return e;
}